

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

StackTrace *
Js::JavascriptExceptionOperators::TrimStackTraceForThrownObject
          (StackTrace *stackTraceIn,Var thrownObject,ScriptContext *scriptContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint64 uVar6;
  Recycler *alloc;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this;
  Type *other;
  int iVar7;
  int i;
  int index;
  undefined1 local_60 [8];
  TrackAllocData data;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((DAT_015bc474 != '\x01') || (scriptContext->threadContext->hasCatchHandler == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x584,"(CrawlStackForWER(scriptContext))","CrawlStackForWER(scriptContext)")
    ;
    if (!bVar3) goto LAB_00a96ce0;
    *puVar5 = 0;
  }
  if (stackTraceIn == (StackTrace *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x585,"(stackTraceIn)","stackTraceIn");
    if (!bVar3) goto LAB_00a96ce0;
    *puVar5 = 0;
  }
  uVar6 = GetStackTraceLimit(thrownObject,scriptContext);
  iVar7 = (int)uVar6;
  if (iVar7 == 0) {
    this = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
    if ((stackTraceIn->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).count < 1) {
      this = stackTraceIn;
    }
  }
  else {
    bVar3 = IsErrorInstance(thrownObject);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                         ,0x588,"(stackTraceLimit == 0 || IsErrorInstance(thrownObject))",
                         "stackTraceLimit == 0 || IsErrorInstance(thrownObject)");
      if (!bVar3) goto LAB_00a96ce0;
      *puVar5 = 0;
    }
    this = stackTraceIn;
    if (iVar7 < (stackTraceIn->
                super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                ).count) {
      if (iVar7 < 1) {
        this = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)0x0;
      }
      else {
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)&data.field_0x24,
                   ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                   ExceptionType_OutOfMemory);
        local_60 = (undefined1  [8])
                   &JsUtil::
                    List<Js::JavascriptExceptionContext::StackFrame,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                    ::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_4dbc29c;
        data.filename._0_4_ = 0x595;
        alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60)
        ;
        index = 0;
        this = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)new<Memory::Recycler>(0x30,alloc,0x387914);
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).alloc = scriptContext->recycler;
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e9d38;
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).buffer.ptr = (StackFrame *)0x0;
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).count = 0;
        this->length = 0;
        this->increment = 4;
        do {
          other = JsUtil::
                  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(stackTraceIn,index);
          JsUtil::
          List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::EnsureArray(this,0);
          JavascriptExceptionContext::StackFrame::operator=
                    ((this->
                     super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                     ).buffer.ptr +
                     (this->
                     super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                     ).count,other);
          pTVar1 = &(this->
                    super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                    ).count;
          *pTVar1 = *pTVar1 + 1;
          index = index + 1;
        } while (iVar7 != index);
        BVar4 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                             ,0x59b,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                             "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
          if (!bVar3) {
LAB_00a96ce0:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)&data.field_0x24);
      }
    }
  }
  return this;
}

Assistant:

JavascriptExceptionContext::StackTrace* JavascriptExceptionOperators::TrimStackTraceForThrownObject(JavascriptExceptionContext::StackTrace* stackTraceIn, Var thrownObject, ScriptContext& scriptContext)
    {
        Assert(CrawlStackForWER(scriptContext)); // Don't trim if crawl for Error.stack
        Assert(stackTraceIn);

        int stackTraceLimit = static_cast<int>(GetStackTraceLimit(thrownObject, &scriptContext));
        Assert(stackTraceLimit == 0 || IsErrorInstance(thrownObject));

        if (stackTraceIn->Count() <= stackTraceLimit)
        {
            return stackTraceIn;
        }

        JavascriptExceptionContext::StackTrace* stackTraceTrimmed = NULL;
        if (stackTraceLimit > 0)
        {
            HRESULT hr;
            BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
            {
                stackTraceTrimmed = RecyclerNew(scriptContext.GetRecycler(), JavascriptExceptionContext::StackTrace, scriptContext.GetRecycler());
                for (int i = 0; i < stackTraceLimit; i++)
                {
                    stackTraceTrimmed->Add(stackTraceIn->Item(i));
                }
            }
            END_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_INSCRIPT(hr);
        }